

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

Struct * __thiscall wasm::HeapType::getStruct(HeapType *this)

{
  ulong uVar1;
  
  uVar1 = this->id;
  if ((0x7c < uVar1) && (*(int *)(uVar1 + 0x30) == 2)) {
    return (Struct *)(uVar1 + 0x38);
  }
  __assert_fail("isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x39f,"const Struct &wasm::HeapType::getStruct() const");
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }